

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::
MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::ContainsMatcher>
::MatchExpr(MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::ContainsMatcher>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
           ContainsMatcher *matcher,StringRef *matcherString)

{
  undefined8 uVar1;
  bool result;
  undefined8 *in_RCX;
  long *in_RDX;
  _func_int **in_RSI;
  ITransientExpression *in_RDI;
  ContainsMatcher *in_stack_ffffffffffffffd0;
  
  result = (bool)(**(code **)(*in_RDX + 0x18))(in_RDX,in_RSI);
  ITransientExpression::ITransientExpression(in_RDI,true,result);
  in_RDI->_vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0028b668;
  in_RDI[1]._vptr_ITransientExpression = in_RSI;
  Matchers::StdString::ContainsMatcher::ContainsMatcher
            (in_stack_ffffffffffffffd0,(ContainsMatcher *)in_RDI);
  in_RDI[9]._vptr_ITransientExpression = (_func_int **)*in_RCX;
  uVar1 = in_RCX[1];
  in_RDI[9].m_isBinaryExpression = (bool)(char)uVar1;
  in_RDI[9].m_result = (bool)(char)((ulong)uVar1 >> 8);
  *(int6 *)&in_RDI[9].field_0xa = (int6)((ulong)uVar1 >> 0x10);
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}